

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O2

void __thiscall TPZGenGrid2D::SetPointBC(TPZGenGrid2D *this,TPZGeoMesh *gr,TPZVec<double> *x,int bc)

{
  TPZGeoEl *this_00;
  int iVar1;
  TPZGeoNode *pTVar2;
  long lVar3;
  TPZGeoEl **ppTVar4;
  TPZGeoNode *pTVar5;
  int i;
  long nelem;
  TPZGeoElBC local_38;
  
  pTVar2 = TPZGeoMesh::FindNode(gr,x);
  lVar3 = (gr->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  nelem = 0;
  if (lVar3 < 1) {
    lVar3 = nelem;
  }
  do {
    if (nelem == lVar3) {
      return;
    }
    ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(gr->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
    this_00 = *ppTVar4;
    if (this_00 != (TPZGeoEl *)0x0) {
      iVar1 = (**(code **)(*(long *)this_00 + 0x98))(this_00);
      i = 0;
      if (iVar1 < 1) {
        iVar1 = i;
      }
      for (; iVar1 != i; i = i + 1) {
        pTVar5 = TPZGeoEl::NodePtr(this_00,i);
        if (pTVar5 == pTVar2) {
          TPZGeoElBC::TPZGeoElBC(&local_38,this_00,i,bc);
          return;
        }
      }
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

void TPZGenGrid2D::SetPointBC(TPZGeoMesh *gr, TPZVec<REAL> &x, int bc) {
    // look for an element/corner node whose distance is close to start
    TPZGeoNode *gn1 = gr->FindNode(x);
    int64_t iel;
    int64_t nelem = gr->ElementVec().NElements();
    TPZGeoEl *gel;
    for (iel = 0; iel < nelem; iel++) {
        gel = gr->ElementVec()[iel];
        if (!gel) continue;
        int nc = gel->NCornerNodes();
        int c;
        for (c = 0; c < nc; c++) {
            TPZGeoNode *gn = gel->NodePtr(c);
            if (gn == gn1) {
                break;
            }
        }
        if (c < nc) {
            TPZGeoElBC(gel, c, bc);
            return;
        }
    }
}